

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# taggedptr.h
# Opt level: O0

optional<pbrt::ShapeIntersection> *
pbrt::detail::
DispatchCPU<pbrt::Primitive::Intersect(pbrt::Ray_const&,float)const::__0&,pstd::optional<pbrt::ShapeIntersection>,pbrt::SimplePrimitive,pbrt::GeometricPrimitive,pbrt::TransformedPrimitive,pbrt::AnimatedPrimitive,pbrt::BVHAggregate,pbrt::KdTreeAggregate>
          (anon_class_16_2_d707c455 *func,void *ptr,int index)

{
  undefined4 in_ECX;
  optional<pbrt::ShapeIntersection> *in_RDI;
  
  switch(in_ECX) {
  case 0:
    const::$_0::operator()((anon_class_16_2_d707c455 *)in_RDI,(SimplePrimitive *)in_RDI);
    break;
  case 1:
    const::$_0::operator()((anon_class_16_2_d707c455 *)in_RDI,(GeometricPrimitive *)in_RDI);
    break;
  case 2:
    const::$_0::operator()((anon_class_16_2_d707c455 *)in_RDI,(TransformedPrimitive *)in_RDI);
    break;
  case 3:
    const::$_0::operator()((anon_class_16_2_d707c455 *)in_RDI,(AnimatedPrimitive *)in_RDI);
    break;
  case 4:
    const::$_0::operator()((anon_class_16_2_d707c455 *)in_RDI,(BVHAggregate *)in_RDI);
    break;
  default:
    const::$_0::operator()((anon_class_16_2_d707c455 *)in_RDI,(KdTreeAggregate *)in_RDI);
  }
  return in_RDI;
}

Assistant:

auto DispatchCPU(F &&func, const void *ptr, int index) {
    DCHECK_GE(index, 0);
    DCHECK_LT(index, 6);

    switch (index) {
    case 0:
        return func((const T0 *)ptr);
    case 1:
        return func((const T1 *)ptr);
    case 2:
        return func((const T2 *)ptr);
    case 3:
        return func((const T3 *)ptr);
    case 4:
        return func((const T4 *)ptr);
    default:
        return func((const T5 *)ptr);
    }
}